

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O3

void absl::lts_20250127::base_internal::AddToFreelist(void *v,Arena *arena)

{
  AllocList *pAVar1;
  long *plVar2;
  uint uVar3;
  AllocList *e;
  int iVar4;
  uint uVar5;
  ulong *puVar6;
  uint *puVar7;
  AllocList *pAVar8;
  ulong uVar9;
  ulong uVar10;
  AllocList *prev [30];
  ArenaLock AStack_2d0;
  AllocList *apAStack_240 [31];
  AllocList *pAStack_148;
  AllocList *local_118 [31];
  
  pAVar1 = (AllocList *)((long)v + -0x20);
  if ((*(ulong *)((long)v + -0x18) ^ (ulong)pAVar1) == 0x4c833e95) {
    if (*(Arena **)((long)v + -0x10) == arena) {
      iVar4 = LLA_SkiplistLevels(*(size_t *)((long)v + -0x20),arena->min_size,&arena->random);
      *(int *)v = iVar4;
      LLA_SkiplistInsert(&arena->freelist,pAVar1,local_118);
      *(ulong *)((long)v + -0x18) = (ulong)pAVar1 ^ 0xffffffffb37cc16a;
      Coalesce(pAVar1);
      Coalesce(local_118[0]);
      return;
    }
  }
  else {
    AddToFreelist();
  }
  AddToFreelist();
  if (v == (void *)0x0) {
    return;
  }
  pAStack_148 = pAVar1;
  anon_unknown_0::ArenaLock::ArenaLock(&AStack_2d0,arena);
  if (v < (void *)0xffffffffffffffe0) {
    uVar10 = (long)v + arena->round_up + 0x1f;
    if ((long)v + 0x20U <= uVar10) {
      uVar10 = uVar10 & -arena->round_up;
      pAVar1 = &arena->freelist;
      do {
        iVar4 = LLA_SkiplistLevels(uVar10,arena->min_size,(uint32_t *)0x0);
        if (iVar4 <= (arena->freelist).levels) {
          pAVar8 = pAVar1;
          do {
            if (pAVar8->levels < iVar4) {
              raw_log_internal::RawLog
                        (kFatal,"low_level_alloc.cc",0x1c5,"Check %s failed: %s","i < prev->levels",
                         "too few levels in Next()");
              DoAllocWithArena();
LAB_0102cf27:
              raw_log_internal::RawLog
                        (kFatal,"low_level_alloc.cc",0x1ca,"Check %s failed: %s",
                         "next->header.magic == Magic(kMagicUnallocated, &next->header)",
                         "bad magic number in Next()");
              DoAllocWithArena();
LAB_0102cf59:
              raw_log_internal::RawLog
                        (kFatal,"low_level_alloc.cc",0x1cb,"Check %s failed: %s",
                         "next->header.arena == arena","bad arena pointer in Next()");
              DoAllocWithArena();
LAB_0102cf8b:
              raw_log_internal::RawLog
                        (kFatal,"low_level_alloc.cc",0x1cd,"Check %s failed: %s","prev < next",
                         "unordered freelist");
              DoAllocWithArena();
LAB_0102cfbd:
              raw_log_internal::RawLog
                        (kFatal,"low_level_alloc.cc",0x1d0,"Check %s failed: %s",
                         "reinterpret_cast<char *>(prev) + prev->header.size < reinterpret_cast<char *>(next)"
                         ,"malformed freelist");
              DoAllocWithArena();
              goto LAB_0102cfef;
            }
            e = pAVar8->next[iVar4 + -1];
            if (e == (AllocList *)0x0) break;
            if (((e->header).magic ^ (ulong)e) != 0xffffffffb37cc16a) goto LAB_0102cf27;
            if ((e->header).arena != arena) goto LAB_0102cf59;
            if (pAVar1 != pAVar8) {
              if (e <= pAVar8) goto LAB_0102cf8b;
              if ((AllocList *)((long)pAVar8->next + ((pAVar8->header).size - 0x28)) < e)
              goto LAB_0102cdc4;
              goto LAB_0102cfbd;
            }
LAB_0102cdc4:
            pAVar8 = e;
            if (uVar10 <= (e->header).size) {
              LLA_SkiplistDelete(pAVar1,e,apAStack_240);
              if (CARRY8(arena->min_size,uVar10)) goto LAB_0102d085;
              uVar9 = (e->header).size;
              if (arena->min_size + uVar10 <= uVar9) {
                plVar2 = (long *)((long)e->next + (uVar10 - 0x28));
                *plVar2 = uVar9 - uVar10;
                plVar2[1] = (long)e->next + (uVar10 - 0x28) ^ 0x4c833e95;
                plVar2[2] = (long)arena;
                (e->header).size = uVar10;
                AddToFreelist(plVar2 + 4,arena);
              }
              (e->header).magic = (ulong)e ^ 0x4c833e95;
              if ((e->header).arena == arena) {
                arena->allocation_count = arena->allocation_count + 1;
                anon_unknown_0::ArenaLock::Leave(&AStack_2d0);
                anon_unknown_0::ArenaLock::~ArenaLock((ArenaLock *)(ulong)(uint)AStack_2d0._0_4_);
                return;
              }
              goto LAB_0102d0b7;
            }
          } while( true );
        }
        LOCK();
        uVar3 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
        (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i =
             (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i & 2;
        UNLOCK();
        if (7 < uVar3) {
          SpinLock::SlowUnlock(&arena->mu,uVar3);
        }
        uVar9 = arena->pagesize * 0x10 + (uVar10 - 1);
        if (uVar9 < uVar10) {
LAB_0102cfef:
          raw_log_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1b5,"Check %s failed: %s","sum >= a",
                     "LowLevelAlloc arithmetic overflow");
          DoAllocWithArena();
          goto LAB_0102d021;
        }
        uVar9 = uVar9 & arena->pagesize * -0x10;
        if ((arena->flags & 2) == 0) {
          puVar6 = (ulong *)mmap((void *)0x0,uVar9,3,0x22,-1,0);
        }
        else {
          puVar6 = (ulong *)syscall(9,0,uVar9,3,0x22,0xffffffffffffffff,0);
        }
        if (puVar6 == (ulong *)0xffffffffffffffff) goto LAB_0102d0e9;
        uVar3 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
        if ((uVar3 & 1) == 0) {
          LOCK();
          uVar5 = (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i;
          if (uVar3 == uVar5) {
            (arena->mu).lockword_.super___atomic_base<unsigned_int>._M_i = uVar3 | 1;
            uVar5 = uVar3;
          }
          UNLOCK();
          if ((uVar5 & 1) != 0) goto LAB_0102ce1a;
        }
        else {
LAB_0102ce1a:
          SpinLock::SlowLock(&arena->mu);
        }
        *puVar6 = uVar9;
        puVar6[1] = (ulong)puVar6 ^ 0x4c833e95;
        puVar6[2] = (ulong)arena;
        AddToFreelist(puVar6 + 4,arena);
      } while( true );
    }
  }
  else {
LAB_0102d021:
    raw_log_internal::RawLog
              (kFatal,"low_level_alloc.cc",0x1b5,"Check %s failed: %s","sum >= a",
               "LowLevelAlloc arithmetic overflow");
    DoAllocWithArena();
  }
  raw_log_internal::RawLog
            (kFatal,"low_level_alloc.cc",0x1b5,"Check %s failed: %s","sum >= a",
             "LowLevelAlloc arithmetic overflow");
  DoAllocWithArena();
LAB_0102d085:
  raw_log_internal::RawLog
            (kFatal,"low_level_alloc.cc",0x1b5,"Check %s failed: %s","sum >= a",
             "LowLevelAlloc arithmetic overflow");
  DoAllocWithArena();
LAB_0102d0b7:
  raw_log_internal::RawLog
            (kFatal,"low_level_alloc.cc",0x25f,"Check %s failed: %s","s->header.arena == arena",
             anon_var_dwarf_a22956 + 5);
  DoAllocWithArena();
LAB_0102d0e9:
  puVar7 = (uint *)__errno_location();
  raw_log_internal::RawLog(kFatal,"low_level_alloc.cc",0x239,"mmap error: %d",(ulong)*puVar7);
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                ,0x239,"void *absl::base_internal::DoAllocWithArena(size_t, LowLevelAlloc::Arena *)"
               );
}

Assistant:

static void AddToFreelist(void *v, LowLevelAlloc::Arena *arena) {
  AllocList *f = reinterpret_cast<AllocList *>(reinterpret_cast<char *>(v) -
                                               sizeof(f->header));
  ABSL_RAW_CHECK(f->header.magic == Magic(kMagicAllocated, &f->header),
                 "bad magic number in AddToFreelist()");
  ABSL_RAW_CHECK(f->header.arena == arena,
                 "bad arena pointer in AddToFreelist()");
  f->levels =
      LLA_SkiplistLevels(f->header.size, arena->min_size, &arena->random);
  AllocList *prev[kMaxLevel];
  LLA_SkiplistInsert(&arena->freelist, f, prev);
  f->header.magic = Magic(kMagicUnallocated, &f->header);
  Coalesce(f);        // maybe coalesce with successor
  Coalesce(prev[0]);  // maybe coalesce with predecessor
}